

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

wstring * fmt::v5::to_wstring<int>(wstring *__return_storage_ptr__,int *value)

{
  basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_> local_50;
  basic_buffer<wchar_t> local_40;
  wstring *local_20;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = L'\0';
  local_50.out_.container = &local_40;
  local_40.size_ = 0;
  local_40.capacity_ = 0;
  local_40._vptr_basic_buffer = (_func_int **)&PTR_grow_002a40d0;
  local_50.locale_.locale_ = (void *)0x0;
  local_20 = __return_storage_ptr__;
  basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>::
  write_decimal<int>(&local_50,*value);
  return __return_storage_ptr__;
}

Assistant:

std::wstring to_wstring(const T &value) {
  std::wstring str;
  internal::container_buffer<std::wstring> buf(str);
  wwriter(buf).write(value);
  return str;
}